

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void AnalyzeEnumConstants
               (ExpressionContext *ctx,TypeBase *type,IntrusiveList<SynConstant> constants,
               IntrusiveList<ConstantData> *target)

{
  ModuleData *pMVar1;
  SynIdentifier *pSVar2;
  bool bVar3;
  int iVar4;
  ExprBase *value;
  ExprBase *pEVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ConstantData *pCVar6;
  ExprBase *pEVar7;
  TypeBase *pTVar8;
  ExpressionContext *ctx_00;
  _func_int **pp_Var9;
  IntrusiveList<ConstantData> *pIVar10;
  InplaceStr name;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  ctx_00 = (ExpressionContext *)constants.head;
  if (ctx_00 != (ExpressionContext *)0x0) {
    pEVar7 = (ExprBase *)0x0;
    pIVar10 = target;
    do {
      pMVar1 = (ctx_00->uniqueDependencies).little[3];
      if (pMVar1 == (ModuleData *)0x0) {
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar5 = (ExprBase *)CONCAT44(extraout_var_00,iVar4);
        pTVar8 = ctx->typeInt;
        if (pEVar7 == (ExprBase *)0x0) {
LAB_001fa218:
          pp_Var9 = (_func_int **)0x0;
        }
        else {
          pp_Var9 = (_func_int **)((long)pEVar7[1]._vptr_ExprBase + 1);
        }
        pEVar5->typeID = 6;
        pEVar5->source = (SynBase *)ctx_00;
        pEVar5->type = pTVar8;
        pEVar5->next = (ExprBase *)0x0;
        pEVar5->listed = false;
        pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e63c8;
        pEVar5[1]._vptr_ExprBase = pp_Var9;
LAB_001fa246:
        for (pCVar6 = target->head; pCVar6 != (ConstantData *)0x0; pCVar6 = pCVar6->next) {
          bVar3 = InplaceStr::operator==
                            ((InplaceStr *)
                             &(ctx_00->uniqueDependencies).little[2]->importedFunctionCount,
                             &pCVar6->name->name);
          if (bVar3) {
            pIVar10 = (IntrusiveList<ConstantData> *)(pCVar6->name->name).begin;
            anon_unknown.dwarf_1117a3::Report
                      (ctx,(SynBase *)ctx_00,"ERROR: name \'%.*s\' is already taken",
                       (ulong)(uint)(*(int *)&(pCVar6->name->name).end - (int)pIVar10));
          }
        }
        pMVar1 = (ctx_00->uniqueDependencies).little[2];
        name.end = (char *)pIVar10;
        name.begin = (char *)pMVar1[1].source;
        anon_unknown.dwarf_1117a3::CheckVariableConflict
                  ((anon_unknown_dwarf_1117a3 *)ctx,ctx_00,
                   *(SynBase **)&pMVar1->importedFunctionCount,name);
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        pCVar6 = (ConstantData *)CONCAT44(extraout_var_01,iVar4);
        pSVar2 = (SynIdentifier *)(ctx_00->uniqueDependencies).little[2];
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar7 = (ExprBase *)CONCAT44(extraout_var_02,iVar4);
        pp_Var9 = pEVar5[1]._vptr_ExprBase;
        pEVar7->typeID = 6;
        pEVar7->source = (SynBase *)ctx_00;
        pEVar7->type = type;
        pEVar7->next = (ExprBase *)0x0;
        pEVar7->listed = false;
        pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e63c8;
        pEVar7[1]._vptr_ExprBase = pp_Var9;
        pCVar6->name = pSVar2;
        pCVar6->value = pEVar7;
        pCVar6->next = (ConstantData *)0x0;
        pCVar6->listed = false;
        IntrusiveList<ConstantData>::push_back(target,pCVar6);
      }
      else {
        value = AnalyzeExpression(ctx,(SynBase *)pMVar1);
        pTVar8 = value->type;
        if ((pTVar8 == (TypeBase *)0x0) || (pEVar5 = pEVar7, pTVar8->typeID != 0)) {
          if (pTVar8 != type) {
            pIVar10 = (IntrusiveList<ConstantData> *)0x0;
            value = CreateCast(ctx,(SynBase *)ctx_00,value,ctx->typeInt,false);
          }
          pEVar5 = anon_unknown.dwarf_1117a3::EvaluateExpression(ctx,(SynBase *)ctx_00,value);
          if ((pEVar5 == (ExprBase *)0x0) || (pEVar5->typeID != 6)) {
            anon_unknown.dwarf_1117a3::Report
                      (ctx,(SynBase *)ctx_00,
                       "ERROR: expression didn\'t evaluate to a constant number");
            iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            pEVar5 = (ExprBase *)CONCAT44(extraout_var,iVar4);
            pTVar8 = ctx->typeInt;
            goto LAB_001fa218;
          }
          goto LAB_001fa246;
        }
      }
      ctx_00 = (ExpressionContext *)(ctx_00->uniqueDependencies).little[0];
    } while ((ctx_00 != (ExpressionContext *)0x0) &&
            (pEVar7 = pEVar5, *(int *)&((InplaceStr *)&ctx_00->code)->begin == 0x3a));
  }
  return;
}

Assistant:

void AnalyzeEnumConstants(ExpressionContext &ctx, TypeBase *type, IntrusiveList<SynConstant> constants, IntrusiveList<ConstantData> &target)
{
	ExprIntegerLiteral *last = NULL;

	for(SynConstant *constant = constants.head; constant; constant = getType<SynConstant>(constant->next))
	{
		ExprIntegerLiteral *value = NULL;
			
		if(constant->value)
		{
			ExprBase *rhs = AnalyzeExpression(ctx, constant->value);

			if(isType<TypeError>(rhs->type))
				continue;

			if(rhs->type == type)
				value = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, constant, rhs));
			else
				value = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, constant, CreateCast(ctx, constant, rhs, ctx.typeInt, false)));
		}
		else if(last)
		{
			value = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(constant, ctx.typeInt, last->value + 1);
		}
		else
		{
			value = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(constant, ctx.typeInt, 0);
		}

		if(!value)
		{
			Report(ctx, constant, "ERROR: expression didn't evaluate to a constant number");

			value = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(constant, ctx.typeInt, 0);
		}

		last = value;

		for(ConstantData *curr = target.head; curr; curr = curr->next)
		{
			if(constant->name->name == curr->name->name)
				Report(ctx, constant, "ERROR: name '%.*s' is already taken", FMT_ISTR(curr->name->name));
		}

		CheckVariableConflict(ctx, constant, constant->name->name);

		target.push_back(new (ctx.get<ConstantData>()) ConstantData(constant->name, new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(constant, type, value->value)));
	}
}